

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dct_compress.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *filename;
  char *filename_00;
  char *__s1;
  uint image_width;
  uint image_height;
  int iVar1;
  FILE *__stream;
  FILE *__stream_00;
  void *__buf;
  undefined8 extraout_RAX;
  FILE *__n;
  J_COLOR_SPACE components;
  J_COLOR_SPACE color_space;
  bool called;
  undefined1 local_130 [8];
  function<void_(jpeg_compress_struct_*)> local_128;
  Pl_DCT dct;
  Pl_StdioFile out;
  uchar buf [100];
  
  if (argc == 6) {
    filename = argv[1];
    filename_00 = argv[2];
    image_width = QUtil::string_to_uint(argv[3]);
    image_height = QUtil::string_to_uint(argv[4]);
    __s1 = argv[5];
    iVar1 = strcmp(__s1,"rgb");
    if (iVar1 == 0) {
      components = JCS_YCbCr;
      color_space = JCS_RGB;
    }
    else {
      iVar1 = strcmp(__s1,"cmyk");
      if (iVar1 == 0) {
        components = JCS_CMYK;
        color_space = components;
      }
      else {
        iVar1 = strcmp(__s1,"gray");
        if (iVar1 != 0) {
          usage();
          Pl_DCT::~Pl_DCT(&dct);
          if (local_130 != (undefined1  [8])0x0) {
            (*(*(_func_int ***)local_130)[1])();
          }
          Pl_StdioFile::~Pl_StdioFile(&out);
          _Unwind_Resume(extraout_RAX);
        }
        components = JCS_GRAYSCALE;
        color_space = components;
      }
    }
    __stream = (FILE *)QUtil::safe_fopen(filename,"rb");
    __stream_00 = (FILE *)QUtil::safe_fopen(filename_00,"wb");
    Pl_StdioFile::Pl_StdioFile(&out,"stdout",(FILE *)__stream_00);
    local_128.super__Function_base._M_functor._M_unused._M_object = &called;
    called = false;
    local_128.super__Function_base._M_functor._8_8_ = 0;
    local_128._M_invoker =
         std::
         _Function_handler<void_(jpeg_compress_struct_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/dct_compress.cc:56:21)>
         ::_M_invoke;
    local_128.super__Function_base._M_manager =
         std::
         _Function_handler<void_(jpeg_compress_struct_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/dct_compress.cc:56:21)>
         ::_M_manager;
    Pl_DCT::make_compress_config((Pl_DCT *)local_130,&local_128);
    std::_Function_base::~_Function_base(&local_128.super__Function_base);
    Pl_DCT::Pl_DCT(&dct,"dct",&out.super_Pipeline,image_width,image_height,components,color_space,
                   (CompressConfig *)local_130);
    while (__n = __stream, __buf = (void *)fread(buf,1,100,__stream), __buf != (void *)0x0) {
      Pl_DCT::write(&dct,(int)buf,__buf,(size_t)__n);
    }
    Pl_DCT::finish(&dct);
    if (called != false) {
      fclose(__stream);
      fclose(__stream_00);
      Pl_DCT::~Pl_DCT(&dct);
      if (local_130 != (undefined1  [8])0x0) {
        (*(*(_func_int ***)local_130)[1])();
      }
      Pl_StdioFile::~Pl_StdioFile(&out);
      return 0;
    }
  }
  else {
    usage();
  }
  __assert_fail("called",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libtests/dct_compress.cc"
                ,0x40,"int main(int, char **)");
}

Assistant:

int
main(int argc, char* argv[])
{
    if (argc != 6) {
        usage();
    }

    char* infilename = argv[1];
    char* outfilename = argv[2];
    JDIMENSION width = QUtil::string_to_uint(argv[3]);
    JDIMENSION height = QUtil::string_to_uint(argv[4]);
    char* colorspace = argv[5];
    J_COLOR_SPACE cs =
        ((strcmp(colorspace, "rgb") == 0)        ? JCS_RGB
             : (strcmp(colorspace, "cmyk") == 0) ? JCS_CMYK
             : (strcmp(colorspace, "gray") == 0) ? JCS_GRAYSCALE
                                                 : JCS_UNKNOWN);
    int components = 0;
    switch (cs) {
    case JCS_RGB:
        components = 3;
        break;
    case JCS_CMYK:
        components = 4;
        break;
    case JCS_GRAYSCALE:
        components = 1;
        break;
    default:
        usage();
        break;
    }

    FILE* infile = QUtil::safe_fopen(infilename, "rb");
    FILE* outfile = QUtil::safe_fopen(outfilename, "wb");
    Pl_StdioFile out("stdout", outfile);
    bool called = false;
    auto callback = [&called](jpeg_compress_struct*) { called = true; };
    auto config = Pl_DCT::make_compress_config(callback);
    unsigned char buf[100];
    Pl_DCT dct("dct", &out, width, height, components, cs, config.get());
    while (size_t len = fread(buf, 1, sizeof(buf), infile)) {
        dct.write(buf, len);
    }
    dct.finish();
    assert(called);

    fclose(infile);
    fclose(outfile);
    return 0;
}